

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  UartConfig local_4c;
  
  LogLevelSet(2);
  snprintf(local_4c.device,0x40,"%s",argv[1]);
  local_4c.speed = 0x1007;
  iVar1 = UartInitialize(&local_4c);
  if (iVar1 != 0) {
    iVar1 = LogLevelValid(0);
    if (iVar1 != 0) {
      LogWrite(0,"main","_uart_init",0x69,"uart init failed.");
    }
  }
  unisound_app_start(_hbm_command_cb);
  do {
    usleep(1000000);
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
  LogLevelSet(N_LOG_TRACK);
  _uart_init(argc, argv);
  unisound_app_start(_hbm_command_cb);
  while (1) usleep(1000 * 1000);
  return 0;
}